

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

bool __thiscall ON_ClippingPlane::Write(ON_ClippingPlane *this,ON_BinaryArchive *file)

{
  bool bVar1;
  int iVar2;
  ON_UUID *pOVar3;
  ON_ClippingPlaneData *pOVar4;
  int *piVar5;
  double x;
  uchar lastTypeCode;
  uchar c_3;
  int iStack_78;
  uchar c_2;
  int layer_index;
  int i_1;
  int count_1;
  uchar c_1;
  int local_5c;
  int i;
  int count;
  uchar c;
  ON_UUID *ids;
  ON_ClippingPlaneData *data;
  double depth;
  unsigned_short uStack_30;
  unsigned_short uStack_2e;
  ON_UUID viewport_id;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_ClippingPlane *this_local;
  
  unique0x1000035b = file;
  viewport_id.Data4[3] = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,5);
  if (!(bool)viewport_id.Data4[3]) {
    return false;
  }
  depth._4_4_ = 0;
  uStack_30 = 0;
  uStack_2e = 0;
  viewport_id._0_8_ = (uchar  [8])0x0;
  iVar2 = ON_UuidList::Count(&this->m_viewport_ids);
  if (0 < iVar2) {
    pOVar3 = ON_UuidList::Array(&this->m_viewport_ids);
    depth._4_4_ = pOVar3->Data1;
    uStack_30 = pOVar3->Data2;
    uStack_2e = pOVar3->Data3;
    viewport_id._0_8_ = *(undefined8 *)pOVar3->Data4;
  }
  viewport_id.Data4[3] =
       ON_BinaryArchive::WriteUuid(stack0xffffffffffffffe0,(ON_UUID *)((long)&depth + 4));
  if (((((bool)viewport_id.Data4[3]) &&
       (viewport_id.Data4[3] =
             ON_BinaryArchive::WriteUuid(stack0xffffffffffffffe0,&this->m_plane_id),
       (bool)viewport_id.Data4[3])) &&
      (viewport_id.Data4[3] = ON_BinaryArchive::WritePlane(stack0xffffffffffffffe0,&this->m_plane),
      (bool)viewport_id.Data4[3])) &&
     ((viewport_id.Data4[3] =
            ON_BinaryArchive::WriteBool(stack0xffffffffffffffe0,(bool)(this->m_bEnabled & 1)),
      (bool)viewport_id.Data4[3] &&
      (viewport_id.Data4[3] = ON_UuidList::Write(&this->m_viewport_ids,stack0xffffffffffffffe0),
      (bool)viewport_id.Data4[3])))) {
    x = Depth(this);
    viewport_id.Data4[3] = ON_BinaryArchive::WriteDouble(stack0xffffffffffffffe0,x);
    if (((bool)viewport_id.Data4[3]) &&
       (viewport_id.Data4[3] =
             ON_BinaryArchive::WriteBool(stack0xffffffffffffffe0,(bool)(this->m_depth_enabled & 1)),
       (bool)viewport_id.Data4[3])) {
      pOVar4 = GetClippingPlaneData((this->m_data_store).m_sn);
      if (((pOVar4 != (ON_ClippingPlaneData *)0x0) &&
          (iVar2 = ON_UuidList::Count(&pOVar4->m_object_id_list), 0 < iVar2)) &&
         (pOVar3 = ON_UuidList::Array(&pOVar4->m_object_id_list), pOVar3 != (ON_UUID *)0x0)) {
        viewport_id.Data4[3] = ON_BinaryArchive::WriteChar(stack0xffffffffffffffe0,'\n');
        if (!(bool)viewport_id.Data4[3]) goto LAB_007cb509;
        iVar2 = ON_UuidList::Count(&pOVar4->m_object_id_list);
        viewport_id.Data4[3] = ON_BinaryArchive::WriteInt(stack0xffffffffffffffe0,iVar2);
        if (!(bool)viewport_id.Data4[3]) goto LAB_007cb509;
        local_5c = 0;
        while ((local_5c < iVar2 &&
               (viewport_id.Data4[3] =
                     ON_BinaryArchive::Write3dmReferencedComponentId
                               (stack0xffffffffffffffe0,ModelGeometry,pOVar3[local_5c]),
               (bool)viewport_id.Data4[3]))) {
          local_5c = local_5c + 1;
        }
        if (viewport_id.Data4[3] == '\0') goto LAB_007cb509;
      }
      if ((pOVar4 != (ON_ClippingPlaneData *)0x0) &&
         (iVar2 = ON_SimpleArray<int>::Count(&pOVar4->m_layer_list), 0 < iVar2)) {
        viewport_id.Data4[3] = ON_BinaryArchive::WriteChar(stack0xffffffffffffffe0,'\v');
        if (!(bool)viewport_id.Data4[3]) goto LAB_007cb509;
        iVar2 = ON_SimpleArray<int>::Count(&pOVar4->m_layer_list);
        viewport_id.Data4[3] = ON_BinaryArchive::WriteInt(stack0xffffffffffffffe0,iVar2);
        if (!(bool)viewport_id.Data4[3]) goto LAB_007cb509;
        for (iStack_78 = 0; iStack_78 < iVar2; iStack_78 = iStack_78 + 1) {
          piVar5 = ON_SimpleArray<int>::operator[](&pOVar4->m_layer_list,iStack_78);
          viewport_id.Data4[3] =
               ON_BinaryArchive::Write3dmReferencedComponentIndex
                         (stack0xffffffffffffffe0,Layer,*piVar5);
          if (!(bool)viewport_id.Data4[3]) break;
        }
        if (viewport_id.Data4[3] == '\0') goto LAB_007cb509;
      }
      if ((((pOVar4 == (ON_ClippingPlaneData *)0x0) || ((pOVar4->m_is_exclusion_list & 1U) != 0)) ||
          ((viewport_id.Data4[3] = ON_BinaryArchive::WriteChar(stack0xffffffffffffffe0,'\f'),
           (bool)viewport_id.Data4[3] &&
           (viewport_id.Data4[3] =
                 ON_BinaryArchive::WriteBool
                           (stack0xffffffffffffffe0,(bool)(pOVar4->m_is_exclusion_list & 1)),
           (bool)viewport_id.Data4[3])))) &&
         (((this->m_participation_lists_enabled & 1U) == 0 ||
          ((viewport_id.Data4[3] = ON_BinaryArchive::WriteChar(stack0xffffffffffffffe0,'\r'),
           (bool)viewport_id.Data4[3] &&
           (viewport_id.Data4[3] =
                 ON_BinaryArchive::WriteBool
                           (stack0xffffffffffffffe0,(bool)(this->m_participation_lists_enabled & 1))
           , (bool)viewport_id.Data4[3])))))) {
        viewport_id.Data4[3] = ON_BinaryArchive::WriteChar(stack0xffffffffffffffe0,'\0');
      }
    }
  }
LAB_007cb509:
  bVar1 = ON_BinaryArchive::EndWrite3dmChunk(stack0xffffffffffffffe0);
  if (!bVar1) {
    viewport_id.Data4[3] = '\0';
  }
  return (bool)(viewport_id.Data4[3] & 1);
}

Assistant:

bool ON_ClippingPlane::Write( ON_BinaryArchive& file ) const
{
  // 20 May 2023 S. Baer (RH-74763)
  // version 1.5 - write clip participation
  bool rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,5);
  if (!rc)
    return false;

  for(;;)
  {
    //version 1.1 - write list of viewport uuids instead of single uuid
    ON_UUID viewport_id = ::ON_nil_uuid;
    if( m_viewport_ids.Count() > 0 )
      viewport_id = *(m_viewport_ids.Array());
    rc = file.WriteUuid(viewport_id);
    if (!rc) break;

    rc = file.WriteUuid(m_plane_id);
    if (!rc) break;

    rc = file.WritePlane(m_plane);
    if (!rc) break;

    rc = file.WriteBool(m_bEnabled);
    if (!rc) break;

    //version 1.1 - write list of viewport uuids instead of single uuid
    rc = m_viewport_ids.Write(file);
    if (!rc) break;

    //version 1.2 - write distance as double
    //version 1.3 - continue to write distance, but the reader now knows to
    //              interpret the distance value in a different way
    double depth = Depth();
    rc = file.WriteDouble(depth);
    if (!rc) break;

    //version 1.4 - write enabled flag for depth
    rc = file.WriteBool(m_depth_enabled);
    if (!rc) break;

    //version 1.5
    ON_ClippingPlaneData* data = GetClippingPlaneData(m_data_store.m_sn);

    if (data && data->m_object_id_list.Count() > 0)
    {
      const ON_UUID* ids = data->m_object_id_list.Array();
      if (ids)
      {
        unsigned char c = ON_ClippingPlaneTypeCodes::ClipParticipationObjectList; // 10
        rc = file.WriteChar(c);
        if (!rc) break;

        int count = data->m_object_id_list.Count();
        rc = file.WriteInt(count);
        if (!rc) break;

        for (int i = 0; i < count; i++)
        {
          rc = file.Write3dmReferencedComponentId(ON_ModelComponent::Type::ModelGeometry, ids[i]);
          if (!rc) break;
        }
        if (!rc) break;
      }
    }
    if (data && data->m_layer_list.Count() > 0)
    {
      unsigned char c = ON_ClippingPlaneTypeCodes::ClipParticipationLayerList; // 11
      rc = file.WriteChar(c);
      if (!rc) break;

      int count = data->m_layer_list.Count();
      rc = file.WriteInt(count);
      if (!rc) break;
      for (int i = 0; i < count; i++)
      {
        int layer_index = data->m_layer_list[i];
        rc = file.Write3dmReferencedComponentIndex(ON_ModelComponent::Type::Layer, layer_index);
        if (!rc) break;
      }
      if (!rc) break;
    }
    if (data && data->m_is_exclusion_list == false)
    {
      unsigned char c = ON_ClippingPlaneTypeCodes::ClipParticipationIsExclusion; // 12
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteBool(data->m_is_exclusion_list);
      if (!rc) break;
    }
    if (m_participation_lists_enabled)
    {
      unsigned char c = ON_ClippingPlaneTypeCodes::ClipParticipationEnabled; // 13
      rc = file.WriteChar(c);
      if (!rc) break;
      rc = file.WriteBool(m_participation_lists_enabled);
      if (!rc) break;
    }

    unsigned char lastTypeCode = 0;
    rc = file.WriteChar(lastTypeCode);
    break;
  }

  if ( !file.EndWrite3dmChunk() )
    rc = false;

  return rc;
}